

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O3

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultCatalog
          (string *__return_storage_ptr__,CatalogSearchPath *this,string *schema)

{
  pointer pCVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  pointer pCVar7;
  
  bVar3 = DefaultSchemaGenerator::IsDefaultSchema(schema);
  if (bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "system";
    pcVar5 = "";
  }
  else {
    pCVar1 = (this->paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar7 = (this->paths).
                  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  .
                  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1)
    {
      iVar4 = ::std::__cxx11::string::compare((char *)pCVar7);
      if ((iVar4 != 0) &&
         (bVar3 = StringUtil::CIEquals((string *)&pCVar7->schema,(string *)schema), bVar3)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (pCVar7->catalog)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,
                   pcVar2 + (pCVar7->catalog)._M_string_length);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = anon_var_dwarf_4ed193b + 9;
    pcVar6 = anon_var_dwarf_4ed193b + 9;
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchPath::GetDefaultCatalog(const string &schema) const {
	if (DefaultSchemaGenerator::IsDefaultSchema(schema)) {
		return SYSTEM_CATALOG;
	}
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.schema, schema)) {
			return path.catalog;
		}
	}
	return INVALID_CATALOG;
}